

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kx.h
# Opt level: O0

int hydro_kx_xx_3(hydro_kx_state *state,hydro_kx_session_keypair *kp,uint8_t *packet3,
                 uint8_t *peer_static_pk,uint8_t *packet2,uint8_t *psk,hydro_kx_keypair *static_kp)

{
  int iVar1;
  undefined1 *in_RCX;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  hydro_kx_state *in_RDI;
  hydro_kx_state *in_R8;
  size_t unaff_retaddr;
  uint8_t *packet3_mac;
  uint8_t *packet3_enc_static_pk;
  uint8_t *packet2_mac;
  uint8_t *peer_enc_static_pk;
  uint8_t *peer_eph_pk;
  uint8_t peer_static_pk_ [32];
  uint32_t *session_k2;
  uint8_t *pk;
  hydro_kx_state *in_stack_ffffffffffffffa8;
  hydro_hash_state *in_stack_ffffffffffffffb0;
  int local_4;
  
  pk = (in_R8->eph_kp).sk;
  session_k2 = (in_R8->h_st).state + 4;
  if (in_RCX == (undefined1 *)0x0) {
    in_RCX = &stack0xffffffffffffffa8;
  }
  hydro_hash_update(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(size_t)in_R8);
  iVar1 = hydro_kx_dh(in_stack_ffffffffffffffa8,(uint8_t *)in_R8,pk);
  if ((((iVar1 == 0) &&
       (iVar1 = hydro_kx_aead_decrypt
                          ((hydro_kx_state *)packet2_mac,packet3_enc_static_pk,packet3_mac,
                           unaff_retaddr), iVar1 == 0)) &&
      (iVar1 = hydro_kx_dh(in_stack_ffffffffffffffa8,(uint8_t *)in_R8,pk), iVar1 == 0)) &&
     (iVar1 = hydro_kx_aead_decrypt
                        ((hydro_kx_state *)packet2_mac,packet3_enc_static_pk,packet3_mac,
                         unaff_retaddr), iVar1 == 0)) {
    hydro_kx_aead_encrypt(in_RDI,in_RSI,in_RDX,(size_t)in_RCX);
    iVar1 = hydro_kx_dh(in_stack_ffffffffffffffa8,(uint8_t *)in_R8,pk);
    if (iVar1 == 0) {
      hydro_hash_update(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(size_t)in_R8);
      hydro_kx_aead_encrypt(in_RDI,in_RSI,in_RDX,(size_t)in_RCX);
      hydro_kx_final(in_R8,pk,(uint8_t *)session_k2);
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int
hydro_kx_xx_3(hydro_kx_state *state, hydro_kx_session_keypair *kp,
              uint8_t       packet3[hydro_kx_XX_PACKET3BYTES],
              uint8_t       peer_static_pk[hydro_kx_PUBLICKEYBYTES],
              const uint8_t packet2[hydro_kx_XX_PACKET2BYTES], const uint8_t psk[hydro_kx_PSKBYTES],
              const hydro_kx_keypair *static_kp)
{
    uint8_t        peer_static_pk_[hydro_kx_PUBLICKEYBYTES];
    const uint8_t *peer_eph_pk        = &packet2[0];
    const uint8_t *peer_enc_static_pk = &packet2[hydro_kx_PUBLICKEYBYTES];
    const uint8_t *packet2_mac =
        &packet2[hydro_kx_PUBLICKEYBYTES + hydro_kx_PUBLICKEYBYTES + hydro_kx_AEAD_MACBYTES];
    uint8_t *packet3_enc_static_pk = &packet3[0];
    uint8_t *packet3_mac           = &packet3[hydro_kx_PUBLICKEYBYTES + hydro_kx_AEAD_MACBYTES];

    if (psk == NULL) {
        psk = zero;
    }
    if (peer_static_pk == NULL) {
        peer_static_pk = peer_static_pk_;
    }
    hydro_hash_update(&state->h_st, peer_eph_pk, hydro_kx_PUBLICKEYBYTES);
    if (hydro_kx_dh(state, state->eph_kp.sk, peer_eph_pk) != 0 ||
        hydro_kx_aead_decrypt(state, peer_static_pk, peer_enc_static_pk,
                              hydro_kx_PUBLICKEYBYTES + hydro_kx_AEAD_MACBYTES) != 0 ||
        hydro_kx_dh(state, state->eph_kp.sk, peer_static_pk) != 0 ||
        hydro_kx_aead_decrypt(state, NULL, packet2_mac, hydro_kx_AEAD_MACBYTES) != 0) {
        return -1;
    }

    hydro_kx_aead_encrypt(state, packet3_enc_static_pk, static_kp->pk, sizeof static_kp->pk);
    if (hydro_kx_dh(state, static_kp->sk, peer_eph_pk) != 0) {
        return -1;
    }
    hydro_hash_update(&state->h_st, psk, hydro_kx_PSKBYTES);
    hydro_kx_aead_encrypt(state, packet3_mac, NULL, 0);
    hydro_kx_final(state, kp->rx, kp->tx);

    return 0;
}